

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inline_table.cpp
# Opt level: O3

void __thiscall
InlineTable_WithArray_Test::~InlineTable_WithArray_Test(InlineTable_WithArray_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this);
  return;
}

Assistant:

TEST(InlineTable, WithArray) {
    std::istringstream input("key = {\"key\"=123,\tkey= [1, \n2\r\n  ,3] } ");
    events_aggregator_t handler;

    loltoml::parse(input, handler);

    std::vector<sax_event_t> expected_events = {
        {sax_event_t::start_document},
        {sax_event_t::key, "key"},
        {sax_event_t::start_inline_table},
        {sax_event_t::key, "key"},
        {sax_event_t::integer, 123},
        {sax_event_t::key, "key"},
        {sax_event_t::start_array},
        {sax_event_t::integer, 1},
        {sax_event_t::integer, 2},
        {sax_event_t::integer, 3},
        {sax_event_t::finish_array, 3},
        {sax_event_t::finish_inline_table, 2},
        {sax_event_t::finish_document}
    };

    EXPECT_EQ(expected_events, handler.events);
}